

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_enum_ostream_operator(t_cpp_generator *this,ostream *out,t_enum *tenum)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string sStack_48;
  
  bVar2 = has_custom_ostream(this,&tenum->super_t_type);
  if (!bVar2) {
    std::operator<<(out,"std::ostream& operator<<(std::ostream& out, const ");
    bVar2 = this->gen_pure_enums_;
    iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
    poVar4 = std::operator<<(out,(string *)CONCAT44(extraout_var,iVar3));
    if (bVar2 == false) {
      std::operator<<(poVar4,"::type&");
    }
    std::operator<<(out," val) ");
    t_oop_generator::scope_up(&this->super_t_oop_generator,out);
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"std::map<int, const char*>::const_iterator it = _");
    iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
    poVar4 = std::operator<<(poVar4,"_VALUES_TO_NAMES.find(val);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"if (it != _");
    iVar3 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar4 = std::operator<<(poVar4,"_VALUES_TO_NAMES.end()) {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"out << it->second;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"} else {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"out << static_cast<int>(val);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"}");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
    poVar4 = std::operator<<(out,(string *)&sStack_48);
    poVar4 = std::operator<<(poVar4,"return out;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_48);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_enum_ostream_operator(std::ostream& out, t_enum* tenum) {

  // If we've been told the consuming application will provide an ostream
  // operator definition then we only make a declaration:

  if (!has_custom_ostream(tenum)) {
    out << "std::ostream& operator<<(std::ostream& out, const ";
    if (gen_pure_enums_) {
      out << tenum->get_name();
    } else {
      out << tenum->get_name() << "::type&";
    }
    out << " val) ";
    scope_up(out);

    out << indent() << "std::map<int, const char*>::const_iterator it = _"
             << tenum->get_name() << "_VALUES_TO_NAMES.find(val);" << endl;
    out << indent() << "if (it != _" << tenum->get_name() << "_VALUES_TO_NAMES.end()) {" << endl;
    indent_up();
    out << indent() << "out << it->second;" << endl;
    indent_down();
    out << indent() << "} else {" << endl;
    indent_up();
    out << indent() << "out << static_cast<int>(val);" << endl;
    indent_down();
    out << indent() << "}" << endl;

    out << indent() << "return out;" << endl;
    scope_down(out);
    out << endl;
  }
}